

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O3

CompressedTexFormat tcu::getAstcFormatByBlockSize(IVec3 *size,bool isSRGB)

{
  int iVar1;
  uint uVar2;
  InternalError *pIVar3;
  long *plVar4;
  size_type *psVar5;
  uint uVar6;
  int iVar8;
  undefined1 auVar7 [16];
  IVec3 IVar9;
  string local_158;
  int local_134;
  int local_130;
  int local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = size->m_data[2];
  if (1 < iVar1) {
    pIVar3 = (InternalError *)__cxa_allocate_exception(0x38);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"3D ASTC textures not currently supported","");
    InternalError::InternalError(pIVar3,&local_158);
    __cxa_throw(pIVar3,&InternalError::typeinfo,Exception::~Exception);
  }
  local_c8 = *(undefined8 *)size->m_data;
  uStack_c0 = 0;
  uVar6 = 0xfffffff5;
  do {
    if (uVar6 < 0x1c) {
      IVar9 = getBlockPixelSize((tcu *)&local_158,uVar6 + COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA);
      auVar7._0_4_ = -(uint)((int)local_158._M_dataplus._M_p == (int)local_c8);
      iVar8 = -(uint)((int)((ulong)local_158._M_dataplus._M_p >> 0x20) == local_c8._4_4_);
      auVar7._4_4_ = auVar7._0_4_;
      auVar7._8_4_ = iVar8;
      auVar7._12_4_ = iVar8;
      uVar2 = movmskpd(IVar9.m_data[0],auVar7);
      if (((((uVar2 & 1) != 0) && ((byte)((byte)uVar2 >> 1) != 0)) &&
          ((int)local_158._M_string_length == iVar1)) && (uVar6 - 0xe < 0xe == isSRGB)) {
        return uVar6 + COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA;
      }
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == 0x1c) {
      pIVar3 = (InternalError *)__cxa_allocate_exception(0x38);
      local_12c = size->m_data[0];
      de::toString<int>(&local_e8,&local_12c);
      std::operator+(&local_70,"Invalid ASTC block size ",&local_e8);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_128._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_128._M_dataplus._M_p == psVar5) {
        local_128.field_2._M_allocated_capacity = *psVar5;
        local_128.field_2._8_8_ = plVar4[3];
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar5;
      }
      local_128._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_130 = size->m_data[1];
      de::toString<int>(&local_90,&local_130);
      std::operator+(&local_50,&local_128,&local_90);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_108._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_108._M_dataplus._M_p == psVar5) {
        local_108.field_2._M_allocated_capacity = *psVar5;
        local_108.field_2._8_8_ = plVar4[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar5;
      }
      local_108._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_134 = size->m_data[2];
      de::toString<int>(&local_b0,&local_134);
      std::operator+(&local_158,&local_108,&local_b0);
      InternalError::InternalError(pIVar3,&local_158);
      __cxa_throw(pIVar3,&InternalError::typeinfo,Exception::~Exception);
    }
  } while( true );
}

Assistant:

bool isEtcFormat (CompressedTexFormat format)
{
	switch (format)
	{
		case COMPRESSEDTEXFORMAT_ETC1_RGB8:
		case COMPRESSEDTEXFORMAT_EAC_R11:
		case COMPRESSEDTEXFORMAT_EAC_SIGNED_R11:
		case COMPRESSEDTEXFORMAT_EAC_RG11:
		case COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11:
		case COMPRESSEDTEXFORMAT_ETC2_RGB8:
		case COMPRESSEDTEXFORMAT_ETC2_SRGB8:
		case COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1:
		case COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1:
		case COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8:
		case COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8:
			return true;

		default:
			return false;
	}
}